

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall matchit::impl::Id<int>::reset(Id<int> *this,int32_t depth)

{
  IdBlock<int> *pIVar1;
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O2__deps_matchit_src_include_matchit_h:1321:44)>
  local_9;
  
  pIVar1 = (*std::__detail::__variant::
             __gen_vtable<std::__detail::__variant::__deduce_visit_result<matchit::impl::IdBlock<int>_&>,_matchit::impl::Overload<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1320:44),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O2/_deps/matchit-src/include/matchit.h:1321:44)>_&&,_std::variant<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>_&>
             ::_S_vtable._M_arr
             [*(__index_type *)
               ((long)&(this->mBlock).
                       super__Variant_base<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Move_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Copy_assign_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Move_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Copy_ctor_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
                       .
                       super__Variant_storage_alias<matchit::impl::IdBlock<int>,_matchit::impl::IdBlock<int>_*>
               + 0x18)]._M_data)(&local_9,&this->mBlock);
  if (depth <= (pIVar1->super_IdBlockBase<int>).mDepth) {
    *(undefined8 *)
     &(pIVar1->super_IdBlockBase<int>).mVariant.
      super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
      super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
      super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
      super__Move_ctor_alias<std::monostate,_int,_int_*,_const_int_*>.
      super__Copy_ctor_alias<std::monostate,_int,_int_*,_const_int_*> = 0;
    *(__index_type *)
     ((long)&(pIVar1->super_IdBlockBase<int>).mVariant.
             super__Variant_base<std::monostate,_int,_int_*,_const_int_*>.
             super__Move_assign_alias<std::monostate,_int,_int_*,_const_int_*>.
             super__Copy_assign_alias<std::monostate,_int,_int_*,_const_int_*> + 8) = '\0';
    (pIVar1->super_IdBlockBase<int>).mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth) const { return block().reset(depth); }